

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O3

void __thiscall Assimp::RemoveVCProcess::Execute(RemoveVCProcess *this,aiScene *pScene)

{
  aiAnimation *this_00;
  aiTexture *paVar1;
  aiMaterial *paVar2;
  aiMesh *this_01;
  bool bVar3;
  uint uVar4;
  Logger *pLVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  undefined8 local_438;
  undefined4 local_430;
  aiString local_42c;
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"RemoveVCProcess begin");
  this->mScene = pScene;
  uVar4 = this->configDeleteFlags;
  uVar6 = (uVar4 & 0x40) >> 6;
  if ((uVar4 & 0x40) != 0) {
    if (pScene->mNumAnimations != 0) {
      uVar7 = 0;
      do {
        this_00 = pScene->mAnimations[uVar7];
        if (this_00 != (aiAnimation *)0x0) {
          aiAnimation::~aiAnimation(this_00);
        }
        operator_delete(this_00,0x448);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumAnimations);
    }
    if (pScene->mAnimations != (aiAnimation **)0x0) {
      operator_delete__(pScene->mAnimations);
    }
    pScene->mAnimations = (aiAnimation **)0x0;
    pScene->mNumAnimations = 0;
    uVar4 = this->configDeleteFlags;
  }
  if ((char)uVar4 < '\0') {
    if (pScene->mNumTextures != 0) {
      uVar7 = 0;
      do {
        paVar1 = pScene->mTextures[uVar7];
        if ((paVar1 != (aiTexture *)0x0) && (paVar1->pcData != (aiTexel *)0x0)) {
          operator_delete__(paVar1->pcData);
        }
        operator_delete(paVar1,0x428);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumTextures);
    }
    if (pScene->mTextures != (aiTexture **)0x0) {
      operator_delete__(pScene->mTextures);
    }
    pScene->mTextures = (aiTexture **)0x0;
    pScene->mNumTextures = 0;
    uVar4 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if (((uVar4 >> 0xb & 1) != 0) && (pScene->mNumMaterials != 0)) {
    if (pScene->mNumMaterials != 1) {
      uVar7 = 1;
      do {
        paVar2 = pScene->mMaterials[uVar7];
        if (paVar2 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(paVar2);
        }
        operator_delete(paVar2,0x10);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumMaterials);
    }
    pScene->mNumMaterials = 1;
    paVar2 = *pScene->mMaterials;
    if (paVar2 == (aiMaterial *)0x0) {
      __assert_fail("__null != helper",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/RemoveVCProcess.cpp"
                    ,0xb1,"virtual void Assimp::RemoveVCProcess::Execute(aiScene *)");
    }
    aiMaterial::Clear(paVar2);
    local_438 = 0x3f19999a3f19999a;
    local_430 = 0x3f19999a;
    aiMaterial::AddBinaryProperty(paVar2,&local_438,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    local_438 = 0x3d4ccccd3d4ccccd;
    local_430 = 0x3d4ccccd;
    aiMaterial::AddBinaryProperty(paVar2,&local_438,0xc,"$clr.ambient",0,0,aiPTI_Float);
    memset(local_42c.data + 0x17,0x1b,0x3e9);
    local_42c.length = 0x16;
    builtin_strncpy(local_42c.data + 0x10,"emoved",7);
    builtin_strncpy(local_42c.data,"Dummy_MaterialsR",0x10);
    aiMaterial::AddProperty(paVar2,&local_42c,"?mat.name",0,0);
    uVar4 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if ((uVar4 >> 8 & 1) != 0) {
    if (pScene->mNumLights != 0) {
      uVar7 = 0;
      do {
        operator_delete(pScene->mLights[uVar7],0x46c);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumLights);
    }
    if (pScene->mLights != (aiLight **)0x0) {
      operator_delete__(pScene->mLights);
    }
    pScene->mLights = (aiLight **)0x0;
    pScene->mNumLights = 0;
    uVar4 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if ((uVar4 >> 9 & 1) != 0) {
    if (pScene->mNumCameras != 0) {
      uVar7 = 0;
      do {
        operator_delete(pScene->mCameras[uVar7],0x438);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumCameras);
    }
    if (pScene->mCameras != (aiCamera **)0x0) {
      operator_delete__(pScene->mCameras);
    }
    pScene->mCameras = (aiCamera **)0x0;
    pScene->mNumCameras = 0;
    uVar4 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if ((uVar4 >> 10 & 1) == 0) {
    if (pScene->mNumMeshes != 0) {
      uVar7 = 0;
      do {
        bVar3 = ProcessMesh(this,pScene->mMeshes[uVar7]);
        uVar6 = (uint)(byte)((byte)uVar6 | bVar3);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumMeshes);
      if ((pScene->mNumMeshes != 0) && (pScene->mNumMaterials != 0)) goto LAB_003ceac3;
    }
  }
  else {
    if (pScene->mNumMeshes != 0) {
      uVar7 = 0;
      do {
        this_01 = pScene->mMeshes[uVar7];
        if (this_01 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(this_01);
        }
        operator_delete(this_01,0x520);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumMeshes);
    }
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    pScene->mMeshes = (aiMesh **)0x0;
    pScene->mNumMeshes = 0;
    uVar6 = 1;
  }
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"Setting AI_SCENE_FLAGS_INCOMPLETE flag");
  if (pScene->mNumMeshes == 0) {
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags & 0xf7;
  }
LAB_003ceac3:
  if (uVar6 == 0) {
    pLVar5 = DefaultLogger::get();
    Logger::debug(pLVar5,"RemoveVCProcess finished. Nothing to be done ...");
  }
  else {
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"RemoveVCProcess finished. Data structure cleanup has been done.");
  }
  return;
}

Assistant:

void RemoveVCProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveVCProcess begin");
    bool bHas = false; //,bMasked = false;

    mScene = pScene;

    // handle animations
    if ( configDeleteFlags & aiComponent_ANIMATIONS)
    {

        bHas = true;
        ArrayDelete(pScene->mAnimations,pScene->mNumAnimations);
    }

    // handle textures
    if ( configDeleteFlags & aiComponent_TEXTURES)
    {
        bHas = true;
        ArrayDelete(pScene->mTextures,pScene->mNumTextures);
    }

    // handle materials
    if ( configDeleteFlags & aiComponent_MATERIALS && pScene->mNumMaterials)
    {
        bHas = true;
        for (unsigned int i = 1;i < pScene->mNumMaterials;++i)
            delete pScene->mMaterials[i];

        pScene->mNumMaterials = 1;
        aiMaterial* helper = (aiMaterial*) pScene->mMaterials[0];
        ai_assert(NULL != helper);
        helper->Clear();

        // gray
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // add a small ambient color value
        clr = aiColor3D(0.05f,0.05f,0.05f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);

        aiString s;
        s.Set("Dummy_MaterialsRemoved");
        helper->AddProperty(&s,AI_MATKEY_NAME);
    }

    // handle light sources
    if ( configDeleteFlags & aiComponent_LIGHTS)
    {
        bHas =  true;
        ArrayDelete(pScene->mLights,pScene->mNumLights);
    }

    // handle camneras
    if ( configDeleteFlags & aiComponent_CAMERAS)
    {
        bHas = true;
        ArrayDelete(pScene->mCameras,pScene->mNumCameras);
    }

    // handle meshes
    if (configDeleteFlags & aiComponent_MESHES)
    {
        bHas = true;
        ArrayDelete(pScene->mMeshes,pScene->mNumMeshes);
    }
    else
    {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        {
            if( ProcessMesh( pScene->mMeshes[a]))
                bHas = true;
        }
    }


    // now check whether the result is still a full scene
    if (!pScene->mNumMeshes || !pScene->mNumMaterials)
    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        ASSIMP_LOG_DEBUG("Setting AI_SCENE_FLAGS_INCOMPLETE flag");

        // If we have no meshes anymore we should also clear another flag ...
        if (!pScene->mNumMeshes)
            pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
    }

    if (bHas) {
        ASSIMP_LOG_INFO("RemoveVCProcess finished. Data structure cleanup has been done.");
    } else {
        ASSIMP_LOG_DEBUG("RemoveVCProcess finished. Nothing to be done ...");
    }
}